

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O3

void kratos::print_ast_node(IRNode *node)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  istream *piVar6;
  pointer filename;
  uint uVar7;
  pointer ppVar8;
  char *local_280;
  ifstream file;
  char local_270;
  undefined7 uStack_26f;
  pointer local_78;
  size_type *local_70;
  string line;
  string result_1;
  
  if (node != (IRNode *)0x0) {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)print_ast_mutex_);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    filename = (node->fn_name_ln).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = (node->fn_name_ln).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (filename != ppVar8) {
      local_78 = ppVar8;
      do {
        bVar2 = fs::exists(&filename->first);
        if (bVar2) {
          local_280 = &local_270;
          _file = 0;
          local_270 = '\0';
          std::__cxx11::string::append((char *)&local_280);
          iVar4 = 0x50;
          do {
            std::__cxx11::string::append((char *)&local_280);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          std::__cxx11::string::append((char *)&local_280);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_280,_file);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if (local_280 != &local_270) {
            operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[94m",5);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(filename->first)._M_dataplus._M_p,
                              (filename->first)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          local_70 = &line._M_string_length;
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length._0_1_ = 0;
          std::ifstream::ifstream((istream *)&local_280,(string *)filename,_S_in);
          uVar7 = 1;
          while( true ) {
            cVar3 = std::ios::widen((char)*(undefined8 *)(local_280 + -0x18) +
                                    (char)(istream *)&local_280);
            piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&local_280,(string *)&local_70,cVar3);
            if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
            uVar1 = filename->second;
            if (uVar7 == uVar1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[91m",5)
              ;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,">",1);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)local_70,(long)line._M_dataplus._M_p
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
              std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
LAB_001e6cec:
              std::ostream::put((char)poVar5);
              std::ostream::flush();
            }
            else if (uVar7 <= uVar1 + 2 && uVar1 - 2 <= uVar7) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[92m",5)
              ;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)local_70,(long)line._M_dataplus._M_p
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[0m",4);
              std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
              goto LAB_001e6cec;
            }
            uVar7 = uVar7 + 1;
          }
          line.field_2._8_8_ = &result_1._M_string_length;
          result_1._M_dataplus._M_p = (pointer)0x0;
          result_1._M_string_length._0_1_ = 0;
          std::__cxx11::string::append(line.field_2._M_local_buf + 8);
          iVar4 = 0x50;
          do {
            std::__cxx11::string::append(line.field_2._M_local_buf + 8);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          std::__cxx11::string::append(line.field_2._M_local_buf + 8);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)line.field_2._8_8_,
                              (long)result_1._M_dataplus._M_p);
          ppVar8 = local_78;
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if ((size_type *)line.field_2._8_8_ != &result_1._M_string_length) {
            operator_delete((void *)line.field_2._8_8_,
                            CONCAT71(result_1._M_string_length._1_7_,
                                     (undefined1)result_1._M_string_length) + 1);
          }
          std::ifstream::~ifstream((istream *)&local_280);
          if (local_70 != &line._M_string_length) {
            operator_delete(local_70,CONCAT71(line._M_string_length._1_7_,
                                              (undefined1)line._M_string_length) + 1);
          }
        }
        filename = filename + 1;
      } while (filename != ppVar8);
    }
    pthread_mutex_unlock((pthread_mutex_t *)print_ast_mutex_);
  }
  return;
}

Assistant:

void print_ast_node(const IRNode* node) {
    if (!node) {
        return;
    }
    print_ast_mutex_.lock();
    if (!node->fn_name_ln.empty()) {
        // print out a blue line
        for (auto const& [filename, line_number] : node->fn_name_ln) {
            if (fs::exists(filename)) {
                std::cerr << blue_line() << std::endl;
                std::cerr << BLUE << filename << ":" << line_number << ENDC << std::endl;
                uint32_t line_count = 0;
                std::string line;
                std::ifstream file(filename);
                while (std::getline(file, line)) {
                    line_count++;
                    if (line_count == line_number) {
                        std::cerr << RED << ">" << line << ENDC << std::endl;
                    } else if (line_count >= line_number - CODE_RANGE &&
                               line_count <= line_number + CODE_RANGE) {
                        std::cerr << GREEN << " " << line << ENDC << std::endl;
                    }
                }
                std::cerr << blue_line() << std::endl;
            }
        }
    }
    print_ast_mutex_.unlock();
}